

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O0

int __thiscall
flow::BinaryInstr<(flow::BinaryOperator)8,_(flow::LiteralType)2>::clone
          (BinaryInstr<(flow::BinaryOperator)8,_(flow::LiteralType)2> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  Value *local_30;
  Value *local_28;
  unique_ptr<flow::BinaryInstr<(flow::BinaryOperator)8,_(flow::LiteralType)2>,_std::default_delete<flow::BinaryInstr<(flow::BinaryOperator)8,_(flow::LiteralType)2>_>_>
  local_20 [2];
  BinaryInstr<(flow::BinaryOperator)8,_(flow::LiteralType)2> *this_local;
  
  local_20[1]._M_t.
  super___uniq_ptr_impl<flow::BinaryInstr<(flow::BinaryOperator)8,_(flow::LiteralType)2>,_std::default_delete<flow::BinaryInstr<(flow::BinaryOperator)8,_(flow::LiteralType)2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_flow::BinaryInstr<(flow::BinaryOperator)8,_(flow::LiteralType)2>_*,_std::default_delete<flow::BinaryInstr<(flow::BinaryOperator)8,_(flow::LiteralType)2>_>_>
  .super__Head_base<0UL,_flow::BinaryInstr<(flow::BinaryOperator)8,_(flow::LiteralType)2>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<flow::BinaryInstr<(flow::BinaryOperator)8,_(flow::LiteralType)2>,_std::default_delete<flow::BinaryInstr<(flow::BinaryOperator)8,_(flow::LiteralType)2>_>,_true,_true>
                  )(__uniq_ptr_data<flow::BinaryInstr<(flow::BinaryOperator)8,_(flow::LiteralType)2>,_std::default_delete<flow::BinaryInstr<(flow::BinaryOperator)8,_(flow::LiteralType)2>_>,_true,_true>
                    )__fn;
  this_local = this;
  local_28 = Instr::operand((Instr *)__fn,0);
  local_30 = Instr::operand((Instr *)__fn,1);
  Value::name_abi_cxx11_((Value *)__fn);
  std::
  make_unique<flow::BinaryInstr<(flow::BinaryOperator)8,(flow::LiteralType)2>,flow::Value*,flow::Value*,std::__cxx11::string_const&>
            ((Value **)local_20,&local_28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30);
  std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
  unique_ptr<flow::BinaryInstr<(flow::BinaryOperator)8,(flow::LiteralType)2>,std::default_delete<flow::BinaryInstr<(flow::BinaryOperator)8,(flow::LiteralType)2>>,void>
            ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)this,local_20);
  std::
  unique_ptr<flow::BinaryInstr<(flow::BinaryOperator)8,_(flow::LiteralType)2>,_std::default_delete<flow::BinaryInstr<(flow::BinaryOperator)8,_(flow::LiteralType)2>_>_>
  ::~unique_ptr(local_20);
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> clone() override {
    return std::make_unique<BinaryInstr<Operator, ResultType>>(
        operand(0), operand(1), name());
  }